

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O2

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Line *_line,Plane *_plane)

{
  vec3 *_point;
  float fVar1;
  float fVar2;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  vec<3,_float,_(glm::qualifier)0> local_30;
  
  __return_storage_ptr__->distance = 0.0;
  _point = _line->m_points;
  fVar1 = distance(_point,_plane);
  fVar2 = distance(_line->m_points + 1,_plane);
  if (fVar1 < 0.0 == 0.0 <= fVar2) {
    local_50._0_8_ = *(undefined8 *)_plane;
    local_50.field_2 =
         *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(_plane + 8);
    fVar1 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                      (&local_50,&_line->m_direction);
    if (1e-10 < ABS(fVar1)) {
      local_50._0_8_ = *(undefined8 *)_plane;
      local_50.field_2 =
           *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(_plane + 8);
      local_40._0_8_ = local_50._0_8_;
      local_40.field_2 = local_50.field_2;
      vVar3 = glm::operator-(&local_40,_point);
      local_30.field_2 = vVar3.field_2;
      local_30._0_8_ = vVar3._0_8_;
      fVar2 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                        (&local_50,&local_30);
      fVar2 = fVar2 / fVar1;
      if ((fVar2 <= 1.0) && (0.0 <= fVar2)) {
        __return_storage_ptr__->hit = true;
        vVar3 = glm::operator*(&_line->m_direction,fVar2);
        local_50.field_2 = vVar3.field_2;
        local_50._0_8_ = vVar3._0_8_;
        vVar3 = glm::operator+(_point,&local_50);
        (__return_storage_ptr__->position).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar3._0_8_;
        (__return_storage_ptr__->position).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)vVar3._0_8_ >> 0x20);
        (__return_storage_ptr__->position).field_2 = vVar3.field_2;
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->hit = false;
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Line& _line, const Plane& _plane) {
    IntersectionData idata;
    
    float dist1 = distance(_line[0], _plane);
    float dist2 = distance(_line[1], _plane);
    int pos1 = sign(dist1);
    int pos2 = sign(dist2);
    
    if (pos1==pos2) {
        idata.hit = false;
        return idata;
    }
    
    float u = 0.0;
    float denom = glm::dot(_plane.getNormal(),_line.getDireciton());
    
    // check if ray is paralles to plane:
    
    if (fabs(denom) > EPS) {
        u= glm::dot(_plane.getNormal(),_plane.getOrigin()-_line[0])/denom;
        // check if intersection is within line-segment:
        if (u>1.0 || u<0) {
            idata.hit = false;
            return idata;
        }
        idata.hit=true;
        idata.position = _line[0]+_line.getDireciton()*u;
    }
    else
        idata.hit = false;
    

    return idata;
}